

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O2

int CfdGetPrivkeyWif(void *handle,char *privkey,int network_type,bool is_compressed,char **wif)

{
  bool bVar1;
  NetType net_type;
  char *pcVar2;
  CfdException *pCVar3;
  bool is_bitcoin;
  allocator local_69;
  Privkey key;
  string privkey_wif;
  
  cfd::Initialize();
  if (wif == (char **)0x0) {
    key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
    key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 1099;
    key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdGetPrivkeyWif";
    cfd::core::logger::warn<>((CfdSourceLocation *)&key,"wif is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&key,"Failed to parameter. wif is null.",(allocator *)&privkey_wif);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&key);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(privkey);
  if (!bVar1) {
    is_bitcoin = true;
    net_type = cfd::capi::ConvertNetType(network_type,&is_bitcoin);
    if (is_bitcoin != false) {
      std::__cxx11::string::string((string *)&privkey_wif,privkey,&local_69);
      cfd::core::Privkey::Privkey(&key,&privkey_wif,kMainnet,true);
      std::__cxx11::string::~string((string *)&privkey_wif);
      cfd::core::Privkey::ConvertWif_abi_cxx11_(&privkey_wif,&key,net_type,is_compressed);
      pcVar2 = cfd::capi::CreateString(&privkey_wif);
      *wif = pcVar2;
      std::__cxx11::string::~string((string *)&privkey_wif);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
      return 0;
    }
    key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
    key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x45a;
    key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdGetPrivkeyWif";
    cfd::core::logger::warn<>((CfdSourceLocation *)&key,"privkey\'s network_type is invalid.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&key,"Failed to parameter. privkey\'s network_type is invalid.",
               (allocator *)&privkey_wif);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&key);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
  key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0x451;
  key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = "CfdGetPrivkeyWif";
  cfd::core::logger::warn<>((CfdSourceLocation *)&key,"privkey is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&key,"Failed to parameter. privkey is null or empty.",
             (allocator *)&privkey_wif);
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&key);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetPrivkeyWif(
    void* handle, const char* privkey, int network_type, bool is_compressed,
    char** wif) {
  try {
    cfd::Initialize();
    if (wif == nullptr) {
      warn(CFD_LOG_SOURCE, "wif is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. wif is null.");
    }
    if (IsEmptyString(privkey)) {
      warn(CFD_LOG_SOURCE, "privkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey is null or empty.");
    }

    bool is_bitcoin = true;
    cfd::core::NetType net_type = ConvertNetType(network_type, &is_bitcoin);
    if (!is_bitcoin) {
      warn(CFD_LOG_SOURCE, "privkey's network_type is invalid.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey's network_type is invalid.");
    }
    Privkey key(privkey);
    std::string privkey_wif = key.ConvertWif(net_type, is_compressed);
    *wif = CreateString(privkey_wif);

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}